

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

int Abc_FrameSetMode(Abc_Frame_t *p,int fNameMode)

{
  int iVar1;
  char local_16 [2];
  int fNameModeOld;
  char Buffer [2];
  Abc_Frame_t *pAStack_10;
  int fNameMode_local;
  Abc_Frame_t *p_local;
  
  fNameModeOld = fNameMode;
  pAStack_10 = p;
  iVar1 = Abc_FrameReadMode(p);
  local_16[0] = (char)fNameModeOld + '0';
  local_16[1] = 0;
  Cmd_FlagUpdateValue(pAStack_10,"namemode",local_16);
  return iVar1;
}

Assistant:

int Abc_FrameSetMode( Abc_Frame_t * p, int fNameMode )
{
    char Buffer[2];
    int fNameModeOld;
    fNameModeOld = Abc_FrameReadMode( p );
    Buffer[0] = '0' + fNameMode;
    Buffer[1] = 0;
    Cmd_FlagUpdateValue( p, "namemode", (char *)Buffer );
    return fNameModeOld;
}